

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O3

bool __thiscall duckdb::StringValueResult::AddRowInternal(StringValueResult *this)

{
  LinePosition *pLVar1;
  undefined8 *puVar2;
  idx_t iVar3;
  idx_t iVar4;
  ValidityMask *pVVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  idx_t iVar6;
  idx_t iVar7;
  idx_t iVar8;
  _Alloc_hider _Var9;
  size_type sVar10;
  bool bVar11;
  const_reference cVar12;
  byte bVar13;
  CSVReaderOptions *pCVar14;
  mapped_type *pmVar15;
  TemplatedValidityData<unsigned_long> *pTVar16;
  _Head_base<0UL,_unsigned_long_*,_false> _Var17;
  idx_t iVar18;
  ulong uVar19;
  string *psVar20;
  LinesPerBoundary error_info;
  LinesPerBoundary error_info_00;
  string *current_path;
  bool first_nl;
  FullLinePosition *local_128;
  idx_t local_120;
  LinesPerBoundary lines_per_batch;
  string borked_line;
  optional_idx local_d8;
  optional_idx local_d0;
  CSVError csv_error;
  
  iVar3 = (this->iterator->pos).buffer_idx;
  iVar4 = (this->iterator->pos).buffer_pos;
  pLVar1 = &(this->current_line_position).end;
  if ((this->current_line_position).end.buffer_idx == iVar3) {
    uVar19 = iVar4 - pLVar1->buffer_pos;
  }
  else {
    uVar19 = ((this->current_line_position).end.buffer_size + iVar4) -
             (this->current_line_position).end.buffer_pos;
  }
  iVar18 = this->buffer_size;
  local_128 = &this->current_line_position;
  if (this->store_line_size == true) {
    CSVErrorHandler::NewMaxLineSize(this->error_handler,uVar19);
  }
  (local_128->begin).buffer_idx = (this->current_line_position).end.buffer_idx;
  iVar6 = (this->current_line_position).end.buffer_size;
  (local_128->begin).buffer_pos = pLVar1->buffer_pos;
  (local_128->begin).buffer_size = iVar6;
  (this->current_line_position).end.buffer_pos = iVar4;
  (this->current_line_position).end.buffer_size = iVar18;
  (this->current_line_position).end.buffer_idx = iVar3;
  pCVar14 = ((this->super_ScannerResult).state_machine)->options;
  if ((pCVar14->maximum_line_size).value < uVar19) {
    borked_line._M_dataplus._M_p._0_1_ = 6;
    csv_error.error_message._M_dataplus._M_p = &DAT_00000001;
    LineError::Insert(&this->current_errors,(CSVErrorType *)&borked_line,(idx_t *)&csv_error,
                      &this->chunk_col_id,&(this->super_ScannerResult).last_position,uVar19);
    pCVar14 = ((this->super_ScannerResult).state_machine)->options;
  }
  if ((pCVar14->null_padding == false) &&
     (uVar19 = this->cur_col_id, uVar19 < this->number_of_columns)) {
    do {
      borked_line._M_dataplus._M_p._0_1_ = 2;
      csv_error.error_message._M_dataplus._M_p = (pointer)(uVar19 - 1);
      LineError::Insert(&this->current_errors,(CSVErrorType *)&borked_line,(idx_t *)&csv_error,
                        &this->chunk_col_id,&(this->super_ScannerResult).last_position,0);
      uVar19 = uVar19 + 1;
    } while (uVar19 < this->number_of_columns);
  }
  bVar11 = LineError::HandleErrors(&this->current_errors,this);
  if (bVar11) {
    csv_error.error_message._M_dataplus._M_p = (pointer)this->number_of_rows;
    pmVar15 = ::std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::FullLinePosition>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::FullLinePosition>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->line_positions_per_row,(key_type *)&csv_error);
    iVar3 = (local_128->begin).buffer_size;
    iVar4 = (local_128->begin).buffer_idx;
    iVar18 = (local_128->end).buffer_pos;
    iVar6 = (local_128->end).buffer_size;
    iVar7 = (local_128->end).buffer_idx;
    (pmVar15->begin).buffer_pos = (local_128->begin).buffer_pos;
    (pmVar15->begin).buffer_size = iVar3;
    (pmVar15->begin).buffer_idx = iVar4;
    (pmVar15->end).buffer_pos = iVar18;
    (pmVar15->end).buffer_size = iVar6;
    (pmVar15->end).buffer_idx = iVar7;
    goto LAB_014f9aa2;
  }
  NullPaddingQuotedNewlineCheck(this);
  this->quoted_new_line = false;
  uVar19 = this->cur_col_id;
  if (uVar19 < this->number_of_columns) {
    if (this->null_padding == true) {
      do {
        pCVar14 = ((this->super_ScannerResult).state_machine)->options;
        if (uVar19 < (ulong)*(uint *)((long)&(pCVar14->force_not_null).
                                             super_vector<bool,_std::allocator<bool>_>.
                                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                                             super__Bvector_impl_data._M_finish.
                                             super__Bit_iterator_base + 8) +
                     ((long)(pCVar14->force_not_null).super_vector<bool,_std::allocator<bool>_>.
                            super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                     (long)(pCVar14->force_not_null).super_vector<bool,_std::allocator<bool>_>.
                           super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8) {
          cVar12 = vector<bool,_true>::get<true>(&pCVar14->force_not_null,uVar19);
        }
        else {
          cVar12 = false;
        }
        if ((this->projecting_columns == true) &&
           ((this->projected_columns).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
            super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
            super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
            super__Head_base<0UL,_bool_*,_false>._M_head_impl[this->cur_col_id] == false)) {
          uVar19 = this->cur_col_id + 1;
          this->cur_col_id = uVar19;
        }
        else {
          uVar19 = this->number_of_rows;
          if (cVar12 == false) {
            pVVar5 = (this->validity_mask).
                     super_vector<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>.
                     super__Vector_base<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[this->chunk_col_id];
            _Var17._M_head_impl = (pVVar5->super_TemplatedValidityMask<unsigned_long>).validity_mask
            ;
            if (_Var17._M_head_impl == (unsigned_long *)0x0) {
              borked_line._M_dataplus._M_p =
                   (pointer)(pVVar5->super_TemplatedValidityMask<unsigned_long>).capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&csv_error,(unsigned_long *)&borked_line);
              sVar10 = csv_error.error_message._M_string_length;
              _Var9 = csv_error.error_message._M_dataplus;
              csv_error.error_message._M_dataplus._M_p = (pointer)0x0;
              csv_error.error_message._M_string_length = 0;
              this_00 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                        ((long)&(pVVar5->super_TemplatedValidityMask<unsigned_long>).validity_data +
                        8))->_M_pi;
              (pVVar5->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)_Var9._M_p;
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
              ((long)&(pVVar5->super_TemplatedValidityMask<unsigned_long>).validity_data + 8))->
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar10;
              if ((this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00),
                 csv_error.error_message._M_string_length != 0)) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           csv_error.error_message._M_string_length);
              }
              pTVar16 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (&(pVVar5->super_TemplatedValidityMask<unsigned_long>).
                                    validity_data);
              _Var17._M_head_impl =
                   (pTVar16->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              (pVVar5->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                   _Var17._M_head_impl;
            }
            bVar13 = (byte)uVar19 & 0x3f;
            _Var17._M_head_impl[uVar19 >> 6] =
                 _Var17._M_head_impl[uVar19 >> 6] &
                 (-2L << bVar13 | 0xfffffffffffffffeU >> 0x40 - bVar13);
          }
          else {
            puVar2 = (undefined8 *)
                     ((long)(this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                            super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                            super__Vector_impl_data._M_start[this->chunk_col_id] + uVar19 * 0x10);
            *puVar2 = 0;
            puVar2[1] = 0;
          }
          uVar19 = this->cur_col_id + 1;
          this->cur_col_id = uVar19;
          this->chunk_col_id = this->chunk_col_id + 1;
        }
      } while (uVar19 < this->number_of_columns);
    }
    else {
      bVar11 = CSVReaderOptions::IgnoreErrors(((this->super_ScannerResult).state_machine)->options);
      if (!bVar11) {
        first_nl = false;
        if ((this->super_ScannerResult).result_size == 1) {
          bVar13 = false;
        }
        else {
          pCVar14 = ((this->super_ScannerResult).state_machine)->options;
          bVar13 = true;
          if ((pCVar14->store_rejects).value == false) {
            bVar13 = (pCVar14->ignore_errors).value ^ 1;
          }
        }
        FullLinePosition::
        ReconstructCurrentLine<std::unordered_map<unsigned_long,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>>>>>
                  (&borked_line,local_128,&first_nl,&this->buffer_handles,(bool)bVar13);
        LinesPerBoundary::LinesPerBoundary
                  (&lines_per_batch,(this->iterator->boundary).boundary_idx,*this->lines_read);
        iVar3 = (this->current_line_position).begin.buffer_pos;
        iVar4 = (this->super_ScannerResult).last_position.buffer_pos;
        iVar18 = (this->super_ScannerResult).last_position.buffer_idx;
        iVar6 = (this->current_line_position).begin.buffer_idx;
        if ((iVar18 == iVar6 && iVar3 == iVar4) &&
           (iVar18 = iVar6,
           (this->current_line_position).begin.buffer_size ==
           (this->super_ScannerResult).last_position.buffer_size)) {
          iVar4 = this->cur_col_id;
          pCVar14 = ((this->super_ScannerResult).state_machine)->options;
          local_120 = lines_per_batch.boundary_idx;
          psVar20 = (string *)(iVar3 + first_nl + this->requested_size * iVar6);
          current_path = (string *)0x14f98d0;
          optional_idx::optional_idx(&local_d0,(idx_t)psVar20);
          error_info.lines_in_batch = (idx_t)&borked_line;
          error_info.boundary_idx = lines_per_batch.lines_in_batch;
          CSVError::IncorrectColumnAmountError
                    (&csv_error,(CSVError *)pCVar14,(CSVReaderOptions *)(iVar4 - 1),local_120,
                     error_info,psVar20,local_d0.index,(optional_idx)&this->path,current_path);
          CSVErrorHandler::Error(this->error_handler,&csv_error,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)csv_error.csv_row._M_dataplus._M_p != &csv_error.csv_row.field_2) {
            operator_delete(csv_error.csv_row._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)csv_error.full_error_message._M_dataplus._M_p !=
              &csv_error.full_error_message.field_2) {
            operator_delete(csv_error.full_error_message._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)csv_error.error_message._M_dataplus._M_p != &csv_error.error_message.field_2) {
LAB_014f9a3c:
            operator_delete(csv_error.error_message._M_dataplus._M_p);
          }
        }
        else {
          iVar7 = this->cur_col_id;
          pCVar14 = ((this->super_ScannerResult).state_machine)->options;
          local_120 = lines_per_batch.boundary_idx;
          iVar8 = this->requested_size;
          uVar19 = (ulong)first_nl;
          psVar20 = (string *)0x14f99a8;
          optional_idx::optional_idx(&local_d8,iVar18 * iVar8 + iVar4);
          error_info_00.lines_in_batch = (idx_t)&borked_line;
          error_info_00.boundary_idx = lines_per_batch.lines_in_batch;
          CSVError::IncorrectColumnAmountError
                    (&csv_error,(CSVError *)pCVar14,(CSVReaderOptions *)(iVar7 - 1),local_120,
                     error_info_00,(string *)(iVar6 * iVar8 + iVar3 + uVar19),local_d8.index,
                     (optional_idx)&this->path,psVar20);
          CSVErrorHandler::Error(this->error_handler,&csv_error,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)csv_error.csv_row._M_dataplus._M_p != &csv_error.csv_row.field_2) {
            operator_delete(csv_error.csv_row._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)csv_error.full_error_message._M_dataplus._M_p !=
              &csv_error.full_error_message.field_2) {
            operator_delete(csv_error.full_error_message._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)csv_error.error_message._M_dataplus._M_p != &csv_error.error_message.field_2)
          goto LAB_014f9a3c;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)borked_line._M_dataplus._M_p != &borked_line.field_2) {
          operator_delete(borked_line._M_dataplus._M_p);
        }
      }
      RemoveLastLine(this);
    }
  }
  csv_error.error_message._M_dataplus._M_p = (pointer)this->number_of_rows;
  pmVar15 = ::std::__detail::
            _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::FullLinePosition>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::FullLinePosition>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->line_positions_per_row,(key_type *)&csv_error);
  iVar3 = (local_128->begin).buffer_size;
  iVar4 = (local_128->begin).buffer_idx;
  iVar18 = (local_128->end).buffer_pos;
  iVar6 = (local_128->end).buffer_size;
  iVar7 = (local_128->end).buffer_idx;
  (pmVar15->begin).buffer_pos = (local_128->begin).buffer_pos;
  (pmVar15->begin).buffer_size = iVar3;
  (pmVar15->begin).buffer_idx = iVar4;
  (pmVar15->end).buffer_pos = iVar18;
  (pmVar15->end).buffer_size = iVar6;
  (pmVar15->end).buffer_idx = iVar7;
  this->cur_col_id = 0;
  this->chunk_col_id = 0;
LAB_014f9aa2:
  uVar19 = this->number_of_rows + 1;
  this->number_of_rows = uVar19;
  return (this->super_ScannerResult).result_size <= uVar19;
}

Assistant:

bool StringValueResult::AddRowInternal() {
	LinePosition current_line_start = {iterator.pos.buffer_idx, iterator.pos.buffer_pos, buffer_size};
	idx_t current_line_size = current_line_start - current_line_position.end;
	if (store_line_size) {
		error_handler.NewMaxLineSize(current_line_size);
	}
	current_line_position.begin = current_line_position.end;
	current_line_position.end = current_line_start;
	if (current_line_size > state_machine.options.maximum_line_size.GetValue()) {
		current_errors.Insert(MAXIMUM_LINE_SIZE, 1, chunk_col_id, last_position, current_line_size);
	}
	if (!state_machine.options.null_padding) {
		for (idx_t col_idx = cur_col_id; col_idx < number_of_columns; col_idx++) {
			current_errors.Insert(TOO_FEW_COLUMNS, col_idx - 1, chunk_col_id, last_position);
		}
	}

	if (current_errors.HandleErrors(*this)) {
		D_ASSERT(buffer_handles.find(current_line_position.begin.buffer_idx) != buffer_handles.end());
		D_ASSERT(buffer_handles.find(current_line_position.end.buffer_idx) != buffer_handles.end());
		line_positions_per_row[static_cast<idx_t>(number_of_rows)] = current_line_position;
		number_of_rows++;
		if (static_cast<idx_t>(number_of_rows) >= result_size) {
			// We have a full chunk
			return true;
		}
		return false;
	}
	NullPaddingQuotedNewlineCheck();
	quoted_new_line = false;
	// We need to check if we are getting the correct number of columns here.
	// If columns are correct, we add it, and that's it.
	if (cur_col_id < number_of_columns) {
		// We have too few columns:
		if (null_padding) {
			while (cur_col_id < number_of_columns) {
				bool empty = false;
				if (cur_col_id < state_machine.options.force_not_null.size()) {
					empty = state_machine.options.force_not_null[cur_col_id];
				}
				if (projecting_columns) {
					if (!projected_columns[cur_col_id]) {
						cur_col_id++;
						continue;
					}
				}
				if (empty) {
					static_cast<string_t *>(vector_ptr[chunk_col_id])[number_of_rows] = string_t();
				} else {
					validity_mask[chunk_col_id]->SetInvalid(static_cast<idx_t>(number_of_rows));
				}
				cur_col_id++;
				chunk_col_id++;
			}
		} else {
			// If we are not null-padding this is an error
			if (!state_machine.options.IgnoreErrors()) {
				bool first_nl = false;
				auto borked_line =
				    current_line_position.ReconstructCurrentLine(first_nl, buffer_handles, PrintErrorLine());
				LinesPerBoundary lines_per_batch(iterator.GetBoundaryIdx(), lines_read);
				if (current_line_position.begin == last_position) {
					auto csv_error = CSVError::IncorrectColumnAmountError(
					    state_machine.options, cur_col_id - 1, lines_per_batch, borked_line,
					    current_line_position.begin.GetGlobalPosition(requested_size, first_nl),
					    last_position.GetGlobalPosition(requested_size, first_nl), path);
					error_handler.Error(csv_error);
				} else {
					auto csv_error = CSVError::IncorrectColumnAmountError(
					    state_machine.options, cur_col_id - 1, lines_per_batch, borked_line,
					    current_line_position.begin.GetGlobalPosition(requested_size, first_nl),
					    last_position.GetGlobalPosition(requested_size), path);
					error_handler.Error(csv_error);
				}
			}
			// If we are here we ignore_errors, so we delete this line
			RemoveLastLine();
		}
	}
	D_ASSERT(buffer_handles.find(current_line_position.begin.buffer_idx) != buffer_handles.end());
	D_ASSERT(buffer_handles.find(current_line_position.end.buffer_idx) != buffer_handles.end());
	line_positions_per_row[static_cast<idx_t>(number_of_rows)] = current_line_position;
	cur_col_id = 0;
	chunk_col_id = 0;
	number_of_rows++;
	if (static_cast<idx_t>(number_of_rows) >= result_size) {
		// We have a full chunk
		return true;
	}
	return false;
}